

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRAM.c
# Opt level: O0

void incrementX(void)

{
  uint16_t switch_nametable;
  uint16_t coarseX_bitmask;
  
  if ((VRAM_state.VRAM_address & 0x1f) == 0x1f) {
    VRAM_state.VRAM_address = VRAM_state.VRAM_address & 0xffe0 ^ 0x400;
  }
  else {
    VRAM_state.VRAM_address = VRAM_state.VRAM_address + 1;
  }
  return;
}

Assistant:

void incrementX() {
    const uint16_t coarseX_bitmask = 0x001F;
    const uint16_t switch_nametable = 0x0400;

    if( (VRAM_state.VRAM_address & coarseX_bitmask) == 31 ) {
        VRAM_state.VRAM_address &= ~coarseX_bitmask;  // CoarseX = 0
        VRAM_state.VRAM_address ^= switch_nametable;  // Switch horizontal nametable
    }
    else VRAM_state.VRAM_address++;
}